

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_reflection_class.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::csharp::ReflectionClassGenerator::WriteDescriptor
          (ReflectionClassGenerator *this,Printer *printer)

{
  Printer *pPVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  Options *pOVar5;
  ulong uVar6;
  FileDescriptor *pFVar7;
  EnumDescriptor *this_00;
  FieldDescriptor *this_01;
  Descriptor *descriptor;
  FileDescriptor *descriptor_00;
  FileDescriptor *descriptor_01;
  EnumDescriptor *descriptor_02;
  FieldDescriptor *descriptor_03;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  string_view filename;
  string_view sVar8;
  string_view local_2b8;
  string_view local_2a8;
  string_view local_298;
  string_view local_288;
  int local_274;
  undefined1 auStack_270 [4];
  int i_3;
  string_view local_260;
  basic_string_view<char,_std::char_traits<char>_> local_250;
  string local_240;
  string_view local_220;
  string local_210;
  int local_1ec;
  undefined1 local_1e8 [4];
  int i_2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extensions;
  string_view local_1c0;
  string local_1b0;
  string_view local_190;
  int local_17c;
  undefined1 auStack_178 [4];
  int i_1;
  string_view local_168;
  string local_158;
  string_view local_138;
  string_view local_128;
  int local_114;
  undefined1 auStack_110 [4];
  int i;
  string_view local_100;
  string_view local_f0;
  string local_e0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string_view local_a0 [2];
  byte local_7a;
  allocator<char> local_79;
  undefined1 local_78 [8];
  string base64;
  string_view local_48;
  string_view local_38;
  string_view local_28;
  Printer *local_18;
  Printer *printer_local;
  ReflectionClassGenerator *this_local;
  
  local_18 = printer;
  printer_local = (Printer *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_28,
             "#region Descriptor\n/// <summary>File descriptor for $file_name$</summary>\npublic static pbr::FileDescriptor Descriptor {\n  get { return descriptor; }\n}\nprivate static pbr::FileDescriptor descriptor;\n\nstatic $reflection_class_name$() {\n"
            );
  local_38 = FileDescriptor::name(this->file_);
  io::Printer::
  Print<char[10],std::basic_string_view<char,std::char_traits<char>>,char[22],std::__cxx11::string>
            (printer,local_28,(char (*) [10])0xad6c81,&local_38,(char (*) [22])0x9f6286,
             &this->reflectionClassname_);
  io::Printer::Indent(local_18);
  pPVar1 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_48,"byte[] descriptorData = global::System.Convert.FromBase64String(\n");
  io::Printer::Print<>(pPVar1,local_48);
  io::Printer::Indent(local_18);
  io::Printer::Indent(local_18);
  pPVar1 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)((long)&base64.field_2 + 8),
             "string.Concat(\n");
  io::Printer::Print<>(pPVar1,stack0xffffffffffffffa8);
  io::Printer::Indent(local_18);
  pOVar5 = SourceGeneratorBase::options(&this->super_SourceGeneratorBase);
  local_7a = 0;
  if ((pOVar5->strip_nonfunctional_codegen & 1U) == 0) {
    FileDescriptorToBase64_abi_cxx11_((string *)local_78,(csharp *)this->file_,descriptor_00);
  }
  else {
    std::allocator<char>::allocator();
    local_7a = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)local_78,"",&local_79);
  }
  if ((local_7a & 1) != 0) {
    std::allocator<char>::~allocator(&local_79);
  }
  while (uVar6 = std::__cxx11::string::size(), pPVar1 = local_18, 0x3c < uVar6) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (local_a0,"\"$base64$\",\n");
    std::__cxx11::string::substr((ulong)&local_c0,(ulong)local_78);
    io::Printer::Print<char[7],std::__cxx11::string>
              (pPVar1,local_a0[0],(char (*) [7])"base64",&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::substr((ulong)local_e0,(ulong)local_78);
    std::__cxx11::string::operator=((string *)local_78,local_e0);
    std::__cxx11::string::~string(local_e0);
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_f0,"\"$base64$\"));\n");
  args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78;
  io::Printer::Print<char[7],std::__cxx11::string>(pPVar1,local_f0,(char (*) [7])"base64",args_1);
  io::Printer::Outdent(local_18);
  io::Printer::Outdent(local_18);
  io::Printer::Outdent(local_18);
  pPVar1 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_100,"descriptor = pbr::FileDescriptor.FromGeneratedCode(descriptorData,\n");
  io::Printer::Print<>(pPVar1,local_100);
  pPVar1 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)auStack_110,
             "    new pbr::FileDescriptor[] { ");
  io::Printer::Print<>(pPVar1,_auStack_110);
  local_114 = 0;
  do {
    iVar4 = local_114;
    iVar3 = FileDescriptor::dependency_count(this->file_);
    pPVar1 = local_18;
    if (iVar3 <= iVar4) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_168,"},\n    new pbr::GeneratedClrTypeInfo(");
      io::Printer::Print<>(pPVar1,local_168);
      iVar4 = FileDescriptor::enum_type_count(this->file_);
      pPVar1 = local_18;
      if (iVar4 < 1) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)
                   &extensions.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,"null, ");
        io::Printer::Print<>(pPVar1,stack0xfffffffffffffe30);
      }
      else {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)auStack_178,"new[] {");
        io::Printer::Print<>(pPVar1,_auStack_178);
        local_17c = 0;
        while( true ) {
          iVar4 = local_17c;
          iVar3 = FileDescriptor::enum_type_count(this->file_);
          pPVar1 = local_18;
          if (iVar3 <= iVar4) break;
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_190,"typeof($type_name$), ");
          this_00 = FileDescriptor::enum_type(this->file_,local_17c);
          GetClassName_abi_cxx11_(&local_1b0,(csharp *)this_00,descriptor_02);
          args_1 = &local_1b0;
          io::Printer::Print<char[10],std::__cxx11::string>
                    (pPVar1,local_190,(char (*) [10])0xb94098,args_1);
          std::__cxx11::string::~string((string *)&local_1b0);
          local_17c = local_17c + 1;
        }
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1c0,"}, ");
        io::Printer::Print<>(pPVar1,local_1c0);
      }
      iVar4 = FileDescriptor::extension_count(this->file_);
      pPVar1 = local_18;
      if (iVar4 < 1) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_260,"null, ");
        io::Printer::Print<>(pPVar1,local_260);
      }
      else {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_1e8);
        iVar4 = FileDescriptor::extension_count(this->file_);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_1e8,(long)iVar4);
        local_1ec = 0;
        while( true ) {
          iVar4 = local_1ec;
          iVar3 = FileDescriptor::extension_count(this->file_);
          pPVar1 = local_18;
          if (iVar3 <= iVar4) break;
          this_01 = FileDescriptor::extension(this->file_,local_1ec);
          GetFullExtensionName_abi_cxx11_(&local_210,(csharp *)this_01,descriptor_03);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_1e8,&local_210);
          std::__cxx11::string::~string((string *)&local_210);
          local_1ec = local_1ec + 1;
        }
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_220,"new pb::Extension[] { $extensions$ }, ");
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_250,", ");
        sVar8._M_str = (char *)args_1;
        sVar8._M_len = (size_t)local_250._M_str;
        absl::lts_20250127::
        StrJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  (&local_240,(lts_20250127 *)local_1e8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_250._M_len,sVar8);
        io::Printer::Print<char[11],std::__cxx11::string>
                  (pPVar1,local_220,(char (*) [11])0xabc296,&local_240);
        std::__cxx11::string::~string((string *)&local_240);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_1e8);
      }
      iVar4 = FileDescriptor::message_type_count(this->file_);
      pPVar1 = local_18;
      if (iVar4 < 1) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_298,"null));\n");
        io::Printer::Print<>(pPVar1,local_298);
      }
      else {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)auStack_270,
                   "new pbr::GeneratedClrTypeInfo[] {\n");
        io::Printer::Print<>(pPVar1,_auStack_270);
        io::Printer::Indent(local_18);
        io::Printer::Indent(local_18);
        io::Printer::Indent(local_18);
        local_274 = 0;
        while( true ) {
          iVar4 = local_274;
          iVar3 = FileDescriptor::message_type_count(this->file_);
          if (iVar3 <= iVar4) break;
          descriptor = FileDescriptor::message_type(this->file_,local_274);
          pPVar1 = local_18;
          iVar4 = local_274;
          iVar3 = FileDescriptor::message_type_count(this->file_);
          WriteGeneratedCodeInfo(this,descriptor,pPVar1,iVar4 == iVar3 + -1);
          local_274 = local_274 + 1;
        }
        io::Printer::Outdent(local_18);
        pPVar1 = local_18;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_288,"\n}));\n");
        io::Printer::Print<>(pPVar1,local_288);
        io::Printer::Outdent(local_18);
        io::Printer::Outdent(local_18);
      }
      io::Printer::Outdent(local_18);
      pPVar1 = local_18;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_2a8,"}\n");
      io::Printer::Print<>(pPVar1,local_2a8);
      pPVar1 = local_18;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_2b8,"#endregion\n\n");
      io::Printer::Print<>(pPVar1,local_2b8);
      std::__cxx11::string::~string((string *)local_78);
      return;
    }
    pOVar5 = SourceGeneratorBase::options(&this->super_SourceGeneratorBase);
    if ((pOVar5->strip_nonfunctional_codegen & 1U) == 0) {
LAB_001f22bb:
      pPVar1 = local_18;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_138,"$full_reflection_class_name$.Descriptor, ");
      pFVar7 = FileDescriptor::dependency(this->file_,local_114);
      GetReflectionClassName_abi_cxx11_(&local_158,(csharp *)pFVar7,descriptor_01);
      args_1 = &local_158;
      io::Printer::Print<char[27],std::__cxx11::string>
                (pPVar1,local_138,(char (*) [27])"full_reflection_class_name",args_1);
      std::__cxx11::string::~string((string *)&local_158);
    }
    else {
      pFVar7 = FileDescriptor::dependency(this->file_,local_114);
      sVar8 = FileDescriptor::name(pFVar7);
      filename._M_str = sVar8._M_str;
      filename._M_len = (size_t)filename._M_str;
      local_128 = sVar8;
      bVar2 = IsKnownFeatureProto((compiler *)sVar8._M_len,filename);
      if (!bVar2) goto LAB_001f22bb;
    }
    local_114 = local_114 + 1;
  } while( true );
}

Assistant:

void ReflectionClassGenerator::WriteDescriptor(io::Printer* printer) {
  printer->Print(
    "#region Descriptor\n"
    "/// <summary>File descriptor for $file_name$</summary>\n"
    "public static pbr::FileDescriptor Descriptor {\n"
    "  get { return descriptor; }\n"
    "}\n"
    "private static pbr::FileDescriptor descriptor;\n"
    "\n"
    "static $reflection_class_name$() {\n",
    "file_name", file_->name(),
    "reflection_class_name", reflectionClassname_);
  printer->Indent();
  printer->Print(
    "byte[] descriptorData = global::System.Convert.FromBase64String(\n");
  printer->Indent();
  printer->Indent();
  printer->Print("string.Concat(\n");
  printer->Indent();

  // TODO: Consider a C#-escaping format here instead of just Base64.
  std::string base64 = options()->strip_nonfunctional_codegen
                           ? ""
                           : FileDescriptorToBase64(file_);
  while (base64.size() > 60) {
    printer->Print("\"$base64$\",\n", "base64", base64.substr(0, 60));
    base64 = base64.substr(60);
  }
  printer->Print("\"$base64$\"));\n", "base64", base64);
  printer->Outdent();
  printer->Outdent();
  printer->Outdent();

  // -----------------------------------------------------------------
  // Invoke InternalBuildGeneratedFileFrom() to build the file.
  printer->Print(
      "descriptor = pbr::FileDescriptor.FromGeneratedCode(descriptorData,\n");
  printer->Print("    new pbr::FileDescriptor[] { ");
  for (int i = 0; i < file_->dependency_count(); i++) {
    if (options()->strip_nonfunctional_codegen &&
        IsKnownFeatureProto(file_->dependency(i)->name())) {
      // Strip feature imports for editions codegen tests.
      continue;
    }
    printer->Print("$full_reflection_class_name$.Descriptor, ",
                   "full_reflection_class_name",
                   GetReflectionClassName(file_->dependency(i)));
  }
  printer->Print("},\n"
      "    new pbr::GeneratedClrTypeInfo(");
  // Specify all the generated code information, recursively.
  if (file_->enum_type_count() > 0) {
      printer->Print("new[] {");
      for (int i = 0; i < file_->enum_type_count(); i++) {
          printer->Print("typeof($type_name$), ", "type_name", GetClassName(file_->enum_type(i)));
      }
      printer->Print("}, ");
  }
  else {
      printer->Print("null, ");
  }  
  if (file_->extension_count() > 0) {
    std::vector<std::string> extensions;
    extensions.reserve(file_->extension_count());
    for (int i = 0; i < file_->extension_count(); i++) {
      extensions.push_back(GetFullExtensionName(file_->extension(i)));
    }
    printer->Print("new pb::Extension[] { $extensions$ }, ", "extensions", absl::StrJoin(extensions, ", "));
  }
  else {
    printer->Print("null, ");
  }
  if (file_->message_type_count() > 0) {
      printer->Print("new pbr::GeneratedClrTypeInfo[] {\n");
      printer->Indent();
      printer->Indent();
      printer->Indent();
      for (int i = 0; i < file_->message_type_count(); i++) {
          WriteGeneratedCodeInfo(file_->message_type(i), printer, i == file_->message_type_count() - 1);
      }
      printer->Outdent();
      printer->Print("\n}));\n");
      printer->Outdent();
      printer->Outdent();
  }
  else {
      printer->Print("null));\n");
  }

  printer->Outdent();
  printer->Print("}\n");
  printer->Print("#endregion\n\n");
}